

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembly.cpp
# Opt level: O0

void activeInfo(BasicBlock *block)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  ulong uVar4;
  string local_458;
  string local_438;
  string local_418;
  string local_3f8;
  string local_3d8;
  string local_3b8;
  string local_398;
  int local_374;
  undefined1 local_370 [4];
  int i_2;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  int local_1cc;
  undefined1 local_1c8 [4];
  int i_1;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_38;
  int local_14;
  BasicBlock *pBStack_10;
  int i;
  BasicBlock *block_local;
  
  pBStack_10 = block;
  sVar2 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::size(&block->block);
  local_14 = (int)sVar2;
  while (local_14 = local_14 + -1, -1 < local_14) {
    pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                       (&pBStack_10->block,(long)local_14);
    std::__cxx11::string::string((string *)&local_38,(string *)pvVar3);
    bVar1 = isOperator(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_14);
      std::__cxx11::string::string((string *)&local_68,(string *)&pvVar3->res);
      std::__cxx11::string::string((string *)&local_88,(string *)&pBStack_10->curFun);
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_14);
      std::__cxx11::string::string((string *)&local_a8,(string *)&pvVar3->res);
      std::__cxx11::string::string((string *)&local_c8,(string *)&pBStack_10->curFun);
      bVar1 = isTempName(&local_a8,&local_c8);
      setActive(&local_68,&local_88,(bool)(~bVar1 & 1));
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_68);
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_14);
      std::__cxx11::string::string((string *)&local_e8,(string *)&pvVar3->name1);
      std::__cxx11::string::string((string *)&local_108,(string *)&pBStack_10->curFun);
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_14);
      std::__cxx11::string::string((string *)&local_128,(string *)&pvVar3->res);
      std::__cxx11::string::string((string *)&local_148,(string *)&pBStack_10->curFun);
      bVar1 = isTempName(&local_128,&local_148);
      setActive(&local_e8,&local_108,(bool)(~bVar1 & 1));
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_e8);
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_14);
      std::__cxx11::string::string((string *)&local_168,(string *)&pvVar3->name2);
      std::__cxx11::string::string((string *)&local_188,(string *)&pBStack_10->curFun);
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_14);
      std::__cxx11::string::string((string *)&local_1a8,(string *)&pvVar3->res);
      std::__cxx11::string::string((string *)local_1c8,(string *)&pBStack_10->curFun);
      bVar1 = isTempName(&local_1a8,(string *)local_1c8);
      setActive(&local_168,&local_188,(bool)(~bVar1 & 1));
      std::__cxx11::string::~string((string *)local_1c8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_168);
    }
  }
  sVar2 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::size(&pBStack_10->block);
  local_1cc = (int)sVar2;
  while (local_1cc = local_1cc + -1, -1 < local_1cc) {
    pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                       (&pBStack_10->block,(long)local_1cc);
    std::__cxx11::string::string((string *)&local_1f0,(string *)pvVar3);
    bVar1 = isOperator(&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_1cc);
      std::__cxx11::string::string((string *)&local_210,(string *)&pvVar3->res);
      std::__cxx11::string::string((string *)&local_230,(string *)&pBStack_10->curFun);
      bVar1 = isActive(&local_210,&local_230);
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_1cc);
      pvVar3->resAct = bVar1;
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_210);
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_1cc);
      std::__cxx11::string::string((string *)&local_250,(string *)&pvVar3->res);
      std::__cxx11::string::string((string *)&local_270,(string *)&pBStack_10->curFun);
      setActive(&local_250,&local_270,false);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_250);
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_1cc);
      std::__cxx11::string::string((string *)&local_290,(string *)&pvVar3->name1);
      std::__cxx11::string::string((string *)&local_2b0,(string *)&pBStack_10->curFun);
      bVar1 = isActive(&local_290,&local_2b0);
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_1cc);
      pvVar3->name1Act = bVar1;
      std::__cxx11::string::~string((string *)&local_2b0);
      std::__cxx11::string::~string((string *)&local_290);
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_1cc);
      std::__cxx11::string::string((string *)&local_2d0,(string *)&pvVar3->name2);
      std::__cxx11::string::string((string *)&local_2f0,(string *)&pBStack_10->curFun);
      bVar1 = isActive(&local_2d0,&local_2f0);
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_1cc);
      pvVar3->name2Act = bVar1;
      std::__cxx11::string::~string((string *)&local_2f0);
      std::__cxx11::string::~string((string *)&local_2d0);
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_1cc);
      std::__cxx11::string::string((string *)&local_310,(string *)&pvVar3->name1);
      std::__cxx11::string::string((string *)&local_330,(string *)&pBStack_10->curFun);
      setActive(&local_310,&local_330,true);
      std::__cxx11::string::~string((string *)&local_330);
      std::__cxx11::string::~string((string *)&local_310);
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_1cc);
      std::__cxx11::string::string((string *)&local_350,(string *)&pvVar3->name2);
      std::__cxx11::string::string((string *)local_370,(string *)&pBStack_10->curFun);
      setActive(&local_350,(string *)local_370,true);
      std::__cxx11::string::~string((string *)local_370);
      std::__cxx11::string::~string((string *)&local_350);
    }
  }
  for (local_374 = 0; uVar4 = (ulong)local_374,
      sVar2 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::size(&pBStack_10->block),
      uVar4 < sVar2; local_374 = local_374 + 1) {
    pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                       (&pBStack_10->block,(long)local_374);
    std::__cxx11::string::string((string *)&local_398,(string *)pvVar3);
    bVar1 = isOperator(&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_374);
      std::__cxx11::string::string((string *)&local_3b8,(string *)&pvVar3->name1);
      std::__cxx11::string::string((string *)&local_3d8,(string *)&pBStack_10->curFun);
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_374);
      setActive(&local_3b8,&local_3d8,(bool)(pvVar3->name1Act & 1));
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)&local_3b8);
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_374);
      std::__cxx11::string::string((string *)&local_3f8,(string *)&pvVar3->name2);
      std::__cxx11::string::string((string *)&local_418,(string *)&pBStack_10->curFun);
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_374);
      setActive(&local_3f8,&local_418,(bool)(pvVar3->name2Act & 1));
      std::__cxx11::string::~string((string *)&local_418);
      std::__cxx11::string::~string((string *)&local_3f8);
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_374);
      std::__cxx11::string::string((string *)&local_438,(string *)&pvVar3->res);
      std::__cxx11::string::string((string *)&local_458,(string *)&pBStack_10->curFun);
      pvVar3 = std::vector<QuadTuple,_std::allocator<QuadTuple>_>::operator[]
                         (&pBStack_10->block,(long)local_374);
      setActive(&local_438,&local_458,(bool)(pvVar3->resAct & 1));
      std::__cxx11::string::~string((string *)&local_458);
      std::__cxx11::string::~string((string *)&local_438);
    }
  }
  return;
}

Assistant:

void activeInfo(BasicBlock &block)
{
    for(int i = block.block.size() - 1; i >= 0; i--) {
        if(!isOperator(block.block[i].op)) {
            continue;
        }
        setActive(block.block[i].res, block.curFun, !isTempName(block.block[i].res, block.curFun));
        setActive(block.block[i].name1, block.curFun, !isTempName(block.block[i].res, block.curFun));
        setActive(block.block[i].name2, block.curFun, !isTempName(block.block[i].res, block.curFun));
    }

    for(int i = block.block.size() - 1; i >= 0; i--) {
        if(!isOperator(block.block[i].op)) {
            continue;
        }
        block.block[i].resAct = isActive(block.block[i].res, block.curFun);
        setActive(block.block[i].res, block.curFun, false);
        block.block[i].name1Act = isActive(block.block[i].name1, block.curFun);
        block.block[i].name2Act = isActive(block.block[i].name2, block.curFun);
        setActive(block.block[i].name1, block.curFun, true);
        setActive(block.block[i].name2, block.curFun, true);
    }

    //保证符号表内活跃信息和四元式内一致
    for(int i = 0; i < block.block.size(); i++) {
        if(!isOperator(block.block[i].op)) {
            continue;
        }
        setActive(block.block[i].name1, block.curFun, block.block[i].name1Act);
        setActive(block.block[i].name2, block.curFun, block.block[i].name2Act);
        setActive(block.block[i].res, block.curFun, block.block[i].resAct);
    }

}